

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O3

bool __thiscall
Diligent::DearchiverBase::NamedResourceCache<Diligent::IRenderPass>::Get
          (NamedResourceCache<Diligent::IRenderPass> *this,ResourceType Type,char *Name,
          IRenderPass **ppResource)

{
  iterator iVar1;
  char (*Args_1) [48];
  bool bVar2;
  string msg;
  unique_lock<std::mutex> Lock;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  unique_lock<std::mutex> local_38;
  
  if ((Name == (char *)0x0) || (Args_1 = (char (*) [48])ppResource, *Name == '\0')) {
    FormatString<char[26],char[35]>
              ((string *)local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Name != nullptr && Name[0] != \'\\0\'",(char (*) [35])ppResource);
    Args_1 = (char (*) [48])0x97;
    DebugAssertionFailed
              ((Char *)CONCAT44(local_58._4_4_,local_58._0_4_),"Get",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x97);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_58._4_4_,local_58._0_4_) != &local_48) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_58._4_4_,local_58._0_4_),local_48._M_allocated_capacity + 1)
      ;
    }
  }
  if ((ppResource == (IRenderPass **)0x0) || (*ppResource != (IRenderPass *)0x0)) {
    FormatString<char[26],char[48]>
              ((string *)local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ppResource != nullptr && *ppResource == nullptr",Args_1);
    DebugAssertionFailed
              ((Char *)CONCAT44(local_58._4_4_,local_58._0_4_),"Get",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_58._4_4_,local_58._0_4_) != &local_48) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_58._4_4_,local_58._0_4_),local_48._M_allocated_capacity + 1)
      ;
    }
  }
  *ppResource = (IRenderPass *)0x0;
  local_38._M_owns = false;
  local_38._M_device = &this->m_Mtx;
  std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  local_58._0_4_ = Type;
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)(local_58 + 8),Name,false);
  iVar1 = std::
          _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntWeakPtr<Diligent::IRenderPass>_>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntWeakPtr<Diligent::IRenderPass>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->m_Map)._M_h,(key_type *)local_58);
  if (((IRenderPass *)local_58._8_8_ != (IRenderPass *)0x0) &&
     ((long)local_48._M_allocated_capacity < 0)) {
    operator_delete__((void *)local_58._8_8_);
  }
  if (iVar1.
      super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntWeakPtr<Diligent::IRenderPass>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    bVar2 = false;
  }
  else {
    RefCntWeakPtr<Diligent::IRenderPass>::Lock((RefCntWeakPtr<Diligent::IRenderPass> *)local_58);
    bVar2 = (IRenderPass *)CONCAT44(local_58._4_4_,local_58._0_4_) != (IRenderPass *)0x0;
    if (bVar2) {
      *ppResource = (IRenderPass *)CONCAT44(local_58._4_4_,local_58._0_4_);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return bVar2;
}

Assistant:

bool DearchiverBase::NamedResourceCache<ResType>::Get(ResourceType Type, const char* Name, ResType** ppResource)
{
    VERIFY_EXPR(Name != nullptr && Name[0] != '\0');
    VERIFY_EXPR(ppResource != nullptr && *ppResource == nullptr);
    *ppResource = nullptr;

    std::unique_lock<std::mutex> Lock{m_Mtx};

    auto it = m_Map.find(NamedResourceKey{Type, Name});
    if (it == m_Map.end())
        return false;

    auto Ptr = it->second.Lock();
    if (!Ptr)
        return false;

    *ppResource = Ptr.Detach();
    return true;
}